

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::ConsoleReporter::ConsoleReporter(ConsoleReporter *this,ReporterConfig *config)

{
  ostream *poVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar3;
  TablePrinter *pTVar4;
  long lVar5;
  allocator_type *paVar6;
  initializer_list<Catch::(anonymous_namespace)::ColumnInfo> __l;
  initializer_list<Catch::(anonymous_namespace)::ColumnInfo> __l_00;
  undefined1 auVar7 [16];
  size_type __dnew;
  allocator_type *local_f0;
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  local_e8;
  ColumnInfo local_d0;
  allocator_type **local_a8;
  allocator_type *local_a0;
  allocator_type *local_98;
  undefined4 local_90;
  undefined1 local_8c;
  undefined8 local_88;
  allocator_type **local_80;
  allocator_type *local_78;
  allocator_type *local_70;
  undefined4 local_68;
  undefined1 local_64;
  undefined8 local_60;
  allocator_type *local_58;
  allocator_type *local_50;
  allocator_type *local_48;
  undefined4 local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  StreamingReporterBase<Catch::ConsoleReporter>::StreamingReporterBase
            (&this->super_StreamingReporterBase<Catch::ConsoleReporter>,config);
  (this->super_StreamingReporterBase<Catch::ConsoleReporter>).super_IStreamingReporter.
  _vptr_IStreamingReporter = (_func_int **)&PTR__ConsoleReporter_001bfcf8;
  pTVar4 = (TablePrinter *)operator_new(0x1a0);
  poVar1 = config->m_stream;
  peVar2 = (config->m_fullConfig).
           super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (config->m_fullConfig).
            super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  iVar3 = (*(peVar2->super_NonCopyable)._vptr_NonCopyable[0x15])();
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  local_d0.name._M_dataplus._M_p = (pointer)&local_d0.name.field_2;
  if ((char)iVar3 == '\0') {
    local_d0.name.field_2._M_allocated_capacity._0_6_ = 0x6d68636e6562;
    local_d0.name.field_2._M_allocated_capacity._6_2_ = 0x7261;
    local_d0.name.field_2._8_6_ = 0x656d616e206b;
    local_d0.name._M_string_length = 0xe;
    local_d0.name.field_2._M_local_buf[0xe] = '\0';
    local_d0.width = 0x25;
    local_d0.justification = Left;
    local_a8 = &local_98;
    local_f0 = (allocator_type *)0x1f;
    local_a8 = (allocator_type **)
               std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_f0);
    local_98 = local_f0;
    builtin_strncpy((char *)((long)local_a8 + 0xf),"an      ",8);
    builtin_strncpy((char *)((long)local_a8 + 0x17)," std dev",8);
    *local_a8 = (allocator_type *)0x2073656c706d6173;
    local_a8[1] = (allocator_type *)0x61656d2020202020;
    local_a0 = local_f0;
    *(allocator_type *)((long)local_a8 + (long)local_f0) = (allocator_type)0x0;
    local_88 = 0x10000000e;
    local_80 = &local_70;
    local_f0 = (allocator_type *)0x23;
    local_80 = (allocator_type **)
               std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_f0);
    local_70 = local_f0;
    local_80[2] = (allocator_type *)0x2020206e61656d20;
    local_80[3] = (allocator_type *)0x2064747320776f6c;
    *local_80 = (allocator_type *)0x6f69746172657469;
    local_80[1] = (allocator_type *)0x776f6c202020736e;
    builtin_strncpy((char *)((long)local_80 + 0x1f)," dev",4);
    local_78 = local_f0;
    *(allocator_type *)((long)local_80 + (long)local_f0) = (allocator_type)0x0;
    local_60 = 0x10000000e;
    paVar6 = (allocator_type *)&local_48;
    local_f0 = (allocator_type *)0x24;
    local_58 = paVar6;
    auVar7 = std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_f0);
    __l_00._M_len = auVar7._8_8_;
    local_58 = auVar7._0_8_;
    local_48 = local_f0;
    *(undefined8 *)(local_58 + 0x10) = 0x20206e61656d2068;
    *(undefined8 *)(local_58 + 0x18) = 0x6474732068676968;
    *(undefined8 *)local_58 = 0x6574616d69747365;
    *(undefined8 *)(local_58 + 8) = 0x6769682020202064;
    *(undefined4 *)(local_58 + 0x20) = 0x76656420;
    local_50 = local_f0;
    local_58[(long)local_f0] = (allocator_type)0x0;
    local_38 = 0x10000000e;
    __l_00._M_array = &local_d0;
    clara::std::
    vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
    ::vector(&local_e8,__l_00,local_f0);
    lVar5 = -0xa0;
    do {
      if (paVar6 != *(allocator_type **)(paVar6 + -0x10)) {
        operator_delete(*(allocator_type **)(paVar6 + -0x10),(ulong)(*(allocator_type **)paVar6 + 1)
                       );
      }
      paVar6 = paVar6 + -0x28;
      lVar5 = lVar5 + 0x28;
    } while (lVar5 != 0);
  }
  else {
    local_d0.name.field_2._M_allocated_capacity._0_6_ = 0x6d68636e6562;
    local_d0.name.field_2._M_allocated_capacity._6_2_ = 0x7261;
    local_d0.name.field_2._8_6_ = 0x656d616e206b;
    local_d0.name._M_string_length = 0xe;
    local_d0.name.field_2._M_local_buf[0xe] = '\0';
    local_d0.width = 0x25;
    local_d0.justification = Left;
    local_a8 = &local_98;
    local_98 = (allocator_type *)0x6d61732020202020;
    local_90 = 0x73656c70;
    local_a0 = (allocator_type *)0xc;
    local_8c = 0;
    local_88 = 0x10000000e;
    local_80 = &local_70;
    local_70 = (allocator_type *)0x7461726574692020;
    local_68 = 0x736e6f69;
    local_78 = (allocator_type *)0xc;
    local_64 = 0;
    local_60 = 0x10000000e;
    paVar6 = (allocator_type *)&local_48;
    local_48 = (allocator_type *)0x2020202020202020;
    local_40 = 0x6e61656d;
    local_50 = (allocator_type *)0xc;
    local_3c = 0;
    local_38 = 0x10000000e;
    __l._M_len = 0xc;
    __l._M_array = &local_d0;
    local_58 = paVar6;
    clara::std::
    vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
    ::vector(&local_e8,__l,(allocator_type *)0x0);
    lVar5 = -0xa0;
    do {
      if (paVar6 != *(allocator_type **)(paVar6 + -0x10)) {
        operator_delete(*(allocator_type **)(paVar6 + -0x10),(ulong)(*(allocator_type **)paVar6 + 1)
                       );
      }
      paVar6 = paVar6 + -0x28;
      lVar5 = lVar5 + 0x28;
    } while (lVar5 != 0);
  }
  pTVar4->m_os = poVar1;
  *(pointer *)
   &(pTVar4->m_columnInfos).
    super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
    ._M_impl = local_e8.
               super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
  (pTVar4->m_columnInfos).
  super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_e8.
       super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pTVar4->m_columnInfos).
  super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_e8.
       super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_e8.
  super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pTVar4->m_oss);
  pTVar4->m_currentColumn = -1;
  pTVar4->m_isOpen = false;
  (this->m_tablePrinter)._M_t.
  super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>._M_t.
  super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>.
  super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl = pTVar4;
  clara::std::
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ::~vector(&local_e8);
  this->m_headerPrinted = false;
  return;
}

Assistant:

ConsoleReporter::ConsoleReporter(ReporterConfig const& config)
    : StreamingReporterBase(config),
    m_tablePrinter(new TablePrinter(config.stream(),
        [&config]() -> std::vector<ColumnInfo> {
        if (config.fullConfig()->benchmarkNoAnalysis())
        {
            return{
                { "benchmark name", CATCH_CONFIG_CONSOLE_WIDTH - 43, ColumnInfo::Left },
                { "     samples", 14, ColumnInfo::Right },
                { "  iterations", 14, ColumnInfo::Right },
                { "        mean", 14, ColumnInfo::Right }
            };
        }
        else
        {
            return{
                { "benchmark name", CATCH_CONFIG_CONSOLE_WIDTH - 43, ColumnInfo::Left },
                { "samples      mean       std dev", 14, ColumnInfo::Right },
                { "iterations   low mean   low std dev", 14, ColumnInfo::Right },
                { "estimated    high mean  high std dev", 14, ColumnInfo::Right }
            };
        }
    }())) {}